

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseExprPrimary(State *state)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 uVar9;
  undefined2 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  bool bVar13;
  char *pcVar14;
  State copy;
  
  pcVar4 = state->mangled_cur;
  pcVar5 = state->out_cur;
  pcVar6 = state->out_begin;
  pcVar7 = state->out_end;
  pcVar8 = state->prev_name;
  uVar9 = state->prev_name_length;
  uVar10 = state->nest_level;
  uVar11 = state->append;
  uVar12 = state->overflowed;
  if (*state->mangled_cur == 'L') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar13 = ParseType(state);
    if (((!bVar13) || (bVar13 = ParseNumber(state,(int *)0x0), !bVar13)) ||
       (pcVar14 = state->mangled_cur, *pcVar14 != 'E')) goto LAB_00112c9b;
LAB_00112da2:
    state->mangled_cur = pcVar14 + 1;
    bVar13 = true;
  }
  else {
LAB_00112c9b:
    state->mangled_cur = pcVar4;
    state->out_cur = pcVar5;
    state->prev_name = pcVar8;
    state->prev_name_length = uVar9;
    state->nest_level = uVar10;
    state->append = (bool)uVar11;
    state->overflowed = (bool)uVar12;
    state->out_begin = pcVar6;
    state->out_end = pcVar7;
    if (*state->mangled_cur == 'L') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar13 = ParseType(state);
      if (bVar13) {
        pcVar3 = state->mangled_cur;
        cVar2 = *pcVar3;
        pcVar14 = pcVar3;
        while ((cVar2 != '\0' && ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0x9fU) < 6))) {
          pcVar1 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
          cVar2 = *pcVar1;
        }
        if ((pcVar14 != pcVar3) && (state->mangled_cur = pcVar14, *pcVar14 == 'E'))
        goto LAB_00112da2;
      }
    }
    state->mangled_cur = pcVar4;
    state->out_cur = pcVar5;
    state->prev_name = pcVar8;
    state->prev_name_length = uVar9;
    state->nest_level = uVar10;
    state->append = (bool)uVar11;
    state->overflowed = (bool)uVar12;
    state->out_begin = pcVar6;
    state->out_end = pcVar7;
    pcVar14 = state->mangled_cur;
    if ((*pcVar14 == 'L') &&
       ((state->mangled_cur = pcVar14 + 1, pcVar14[1] == '_' && (pcVar14[2] == 'Z')))) {
      state->mangled_cur = pcVar14 + 3;
      bVar13 = ParseEncoding(state);
      if ((bVar13) && (pcVar14 = state->mangled_cur, *pcVar14 == 'E')) goto LAB_00112da2;
    }
    state->mangled_cur = pcVar4;
    state->out_cur = pcVar5;
    state->prev_name = pcVar8;
    state->prev_name_length = uVar9;
    state->nest_level = uVar10;
    state->append = (bool)uVar11;
    state->overflowed = (bool)uVar12;
    state->out_begin = pcVar6;
    state->out_end = pcVar7;
    pcVar14 = state->mangled_cur;
    if ((*pcVar14 == 'L') && (pcVar14[1] == 'Z')) {
      state->mangled_cur = pcVar14 + 2;
      bVar13 = ParseEncoding(state);
      if ((bVar13) && (pcVar14 = state->mangled_cur, *pcVar14 == 'E')) goto LAB_00112da2;
    }
    state->prev_name = pcVar8;
    state->prev_name_length = uVar9;
    state->nest_level = uVar10;
    state->append = (bool)uVar11;
    state->overflowed = (bool)uVar12;
    state->out_begin = pcVar6;
    state->out_end = pcVar7;
    state->mangled_cur = pcVar4;
    state->out_cur = pcVar5;
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

static bool ParseExprPrimary(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseNumber(state, NULL) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseFloatNumber(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseMangledName(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "LZ") && ParseEncoding(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  return false;
}